

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* cmSystemTools::SplitEnvPath
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string *value)

{
  pointer pbVar1;
  int iVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  string *p;
  pointer path;
  string_view str;
  string_view sep;
  
  if (SplitEnvPath(std::__cxx11::string_const&)::sep == '\0') {
    iVar2 = __cxa_guard_acquire(&SplitEnvPath(std::__cxx11::string_const&)::sep);
    if (iVar2 != 0) {
      _ZZN13cmSystemTools12SplitEnvPathERKNSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEEE3sep_0
           = 1;
      _ZZN13cmSystemTools12SplitEnvPathERKNSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEEE3sep_1
           = ":";
      __cxa_guard_release(&SplitEnvPath(std::__cxx11::string_const&)::sep);
    }
  }
  sep._M_len = (ulong)
               _ZZN13cmSystemTools12SplitEnvPathERKNSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEEE3sep_0
  ;
  str._M_str = (value->_M_dataplus)._M_p;
  str._M_len = value->_M_string_length;
  sep._M_str = 
  _ZZN13cmSystemTools12SplitEnvPathERKNSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEEE3sep_1;
  cmTokenize_abi_cxx11_(__return_storage_ptr__,str,sep);
  pbVar1 = (__return_storage_ptr__->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (path = (__return_storage_ptr__->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start; path != pbVar1; path = path + 1) {
    cmsys::SystemTools::ConvertToUnixSlashes(path);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> cmSystemTools::SplitEnvPath(std::string const& value)
{
#if defined(_WIN32) && !defined(__CYGWIN__)
  static cm::string_view sep = ";"_s;
#else
  static cm::string_view sep = ":"_s;
#endif
  std::vector<std::string> paths = cmTokenize(value, sep);
  for (std::string& p : paths) {
    SystemTools::ConvertToUnixSlashes(p);
  }
  return paths;
}